

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O1

bool __thiscall soul::heart::PureFunctionCall::mayHaveSideEffects(PureFunctionCall *this)

{
  size_t sVar1;
  pool_ref<soul::heart::Expression> *ppVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  
  bVar3 = Function::mayHaveSideEffects(this->function);
  bVar7 = true;
  if (!bVar3) {
    sVar1 = (this->arguments).numActive;
    bVar7 = sVar1 != 0;
    if (bVar7) {
      ppVar2 = (this->arguments).items;
      iVar5 = (*(ppVar2->object->super_Object)._vptr_Object[10])();
      if ((char)iVar5 == '\0') {
        lVar6 = 8;
        do {
          bVar3 = sVar1 << 3 == lVar6;
          bVar7 = !bVar3;
          if (bVar3) {
            return bVar7;
          }
          cVar4 = (**(code **)(**(long **)((long)&ppVar2->object + lVar6) + 0x50))();
          lVar6 = lVar6 + 8;
        } while (cVar4 == '\0');
      }
    }
  }
  return bVar7;
}

Assistant:

bool mayHaveSideEffects() const override
        {
            if (function.mayHaveSideEffects())
                return true;

            for (auto a : arguments)
                if (a->mayHaveSideEffects())
                    return true;

            return false;
        }